

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# potrf.hpp
# Opt level: O0

size_t remora::bindings::
       potrf_block<remora::dense_matrix_adaptor<double,remora::row_major,remora::dense_tag,remora::cpu_tag>>
                 (matrix_expression<remora::dense_matrix_adaptor<double,_remora::row_major,_remora::dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
                  *param_1)

{
  double dVar1;
  dense_matrix_adaptor<double,_remora::row_major,_remora::dense_tag,_remora::cpu_tag> *this;
  size_type sVar2;
  reference pdVar3;
  size_t k;
  double s;
  size_t i;
  size_t j;
  size_t m;
  double in_stack_ffffffffffffffa0;
  double j_00;
  double in_stack_ffffffffffffffa8;
  dense_matrix_adaptor<double,_remora::row_major,_remora::dense_tag,_remora::cpu_tag>
  *in_stack_ffffffffffffffb0;
  ulong local_40;
  double local_38;
  ulong local_30;
  ulong local_28;
  
  this = matrix_expression<remora::dense_matrix_adaptor<double,_remora::row_major,_remora::dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
         ::operator()(param_1);
  sVar2 = dense_matrix_adaptor<double,_remora::row_major,_remora::dense_tag,_remora::cpu_tag>::size1
                    (this);
  local_28 = 0;
  local_38 = in_stack_ffffffffffffffa0;
  do {
    if (sVar2 <= local_28) {
      return 0;
    }
    for (local_30 = local_28; local_30 < sVar2; local_30 = local_30 + 1) {
      matrix_expression<remora::dense_matrix_adaptor<double,_remora::row_major,_remora::dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
      ::operator()(param_1);
      pdVar3 = dense_matrix_adaptor<double,_remora::row_major,_remora::dense_tag,_remora::cpu_tag>::
               operator()(in_stack_ffffffffffffffb0,(size_type)in_stack_ffffffffffffffa8,
                          (size_type)local_38);
      j_00 = local_38;
      local_38 = *pdVar3;
      for (local_40 = 0; local_40 < local_28; local_40 = local_40 + 1) {
        matrix_expression<remora::dense_matrix_adaptor<double,_remora::row_major,_remora::dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
        ::operator()(param_1);
        pdVar3 = dense_matrix_adaptor<double,_remora::row_major,_remora::dense_tag,_remora::cpu_tag>
                 ::operator()(in_stack_ffffffffffffffb0,(size_type)in_stack_ffffffffffffffa8,
                              (size_type)j_00);
        dVar1 = *pdVar3;
        matrix_expression<remora::dense_matrix_adaptor<double,_remora::row_major,_remora::dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
        ::operator()(param_1);
        pdVar3 = dense_matrix_adaptor<double,_remora::row_major,_remora::dense_tag,_remora::cpu_tag>
                 ::operator()(in_stack_ffffffffffffffb0,(size_type)in_stack_ffffffffffffffa8,
                              (size_type)j_00);
        local_38 = -dVar1 * *pdVar3 + local_38;
      }
      if (local_30 == local_28) {
        if (local_38 <= 0.0) {
          return local_30 + 1;
        }
        in_stack_ffffffffffffffb0 =
             (dense_matrix_adaptor<double,_remora::row_major,_remora::dense_tag,_remora::cpu_tag> *)
             sqrt(local_38);
        matrix_expression<remora::dense_matrix_adaptor<double,_remora::row_major,_remora::dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
        ::operator()(param_1);
        pdVar3 = dense_matrix_adaptor<double,_remora::row_major,_remora::dense_tag,_remora::cpu_tag>
                 ::operator()(in_stack_ffffffffffffffb0,(size_type)in_stack_ffffffffffffffa8,
                              (size_type)j_00);
        *pdVar3 = (double)in_stack_ffffffffffffffb0;
        local_38 = j_00;
      }
      else {
        matrix_expression<remora::dense_matrix_adaptor<double,_remora::row_major,_remora::dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
        ::operator()(param_1);
        pdVar3 = dense_matrix_adaptor<double,_remora::row_major,_remora::dense_tag,_remora::cpu_tag>
                 ::operator()(in_stack_ffffffffffffffb0,(size_type)in_stack_ffffffffffffffa8,
                              (size_type)local_38);
        in_stack_ffffffffffffffa8 = local_38 / *pdVar3;
        matrix_expression<remora::dense_matrix_adaptor<double,_remora::row_major,_remora::dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
        ::operator()(param_1);
        pdVar3 = dense_matrix_adaptor<double,_remora::row_major,_remora::dense_tag,_remora::cpu_tag>
                 ::operator()(in_stack_ffffffffffffffb0,(size_type)in_stack_ffffffffffffffa8,
                              (size_type)local_38);
        *pdVar3 = in_stack_ffffffffffffffa8;
      }
    }
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

std::size_t potrf_block(
	matrix_expression<MatA, cpu_tag>& A,
	row_major, lower
) {
	std::size_t m = A().size1();
	for(size_t j = 0; j < m; j++) {
		for(size_t i = j; i < m; i++) {
			double s = A()(i, j);
			for(size_t k = 0; k < j; k++) {
				s -= A()(i, k) * A()(j, k);
			}
			if(i == j) {
				if(s <= 0)
					return i+1;
				A()(i, j) = std::sqrt(s);
			} else {
				A()(i, j) = s / A()(j , j);
			}
		}
	}
	return 0;
}